

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O3

int __thiscall deqp::egl::MemoryStressTests::init(MemoryStressTests *this,EVP_PKEY_CTX *ctx)

{
  Spec spec;
  Spec spec_00;
  Spec spec_01;
  Spec spec_02;
  Spec spec_03;
  Spec spec_04;
  Spec spec_05;
  Spec spec_06;
  Spec spec_07;
  Spec spec_08;
  int extraout_EAX;
  MemoryStressCase *pMVar1;
  undefined4 uStack_134;
  uint uStack_114;
  undefined4 uStack_f4;
  uint uStack_d4;
  undefined4 uStack_b4;
  uint uStack_94;
  undefined4 uStack_74;
  uint uStack_54;
  undefined4 uStack_34;
  uint uStack_14;
  
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_14 = uStack_14 & 0xffffff00;
  spec._20_4_ = uStack_14;
  spec.maxHeight = 0x100;
  spec.minHeight = 0x100;
  spec.maxWidth = 0x100;
  spec.types = OBJECTTYPE_PBUFFER;
  spec.minWidth = 0x100;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec,"pbuffer_256x256",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_34 = CONCAT31(uStack_34._1_3_,1);
  spec_00._20_4_ = uStack_34;
  spec_00.maxHeight = 0x100;
  spec_00.minHeight = 0x100;
  spec_00.maxWidth = 0x100;
  spec_00.types = OBJECTTYPE_PBUFFER;
  spec_00.minWidth = 0x100;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_00,"pbuffer_256x256_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_54 = uStack_54 & 0xffffff00;
  spec_01._20_4_ = uStack_54;
  spec_01.maxHeight = 0x400;
  spec_01.minHeight = 0x400;
  spec_01.maxWidth = 0x400;
  spec_01.types = OBJECTTYPE_PBUFFER;
  spec_01.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_01,"pbuffer_1024x1024",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_74 = CONCAT31(uStack_74._1_3_,1);
  spec_02._20_4_ = uStack_74;
  spec_02.maxHeight = 0x400;
  spec_02.minHeight = 0x400;
  spec_02.maxWidth = 0x400;
  spec_02.types = OBJECTTYPE_PBUFFER;
  spec_02.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_02,"pbuffer_1024x1024_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_94 = uStack_94 & 0xffffff00;
  spec_03._20_4_ = uStack_94;
  spec_03.maxHeight = 0x400;
  spec_03.minHeight = 0x40;
  spec_03.maxWidth = 0x400;
  spec_03.types = OBJECTTYPE_PBUFFER;
  spec_03.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_03,"pbuffer",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_b4 = CONCAT31(uStack_b4._1_3_,1);
  spec_04._20_4_ = uStack_b4;
  spec_04.maxHeight = 0x400;
  spec_04.minHeight = 0x40;
  spec_04.maxWidth = 0x400;
  spec_04.types = OBJECTTYPE_PBUFFER;
  spec_04.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_04,"pbuffer_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_d4 = uStack_d4 & 0xffffff00;
  spec_05._20_4_ = uStack_d4;
  spec_05.maxHeight = 0x400;
  spec_05.minHeight = 0x400;
  spec_05.maxWidth = 0x400;
  spec_05.types = OBJECTTYPE_CONTEXT;
  spec_05.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_05,"context",
             "Context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_f4 = CONCAT31(uStack_f4._1_3_,1);
  spec_06._20_4_ = uStack_f4;
  spec_06.maxHeight = 0x400;
  spec_06.minHeight = 0x400;
  spec_06.maxWidth = 0x400;
  spec_06.types = OBJECTTYPE_CONTEXT;
  spec_06.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_06,"context_use",
             "Context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_114 = uStack_114 & 0xffffff00;
  spec_07._20_4_ = uStack_114;
  spec_07.maxHeight = 0x400;
  spec_07.minHeight = 0x40;
  spec_07.maxWidth = 0x400;
  spec_07.types = OBJECTTYPE_CONTEXT|OBJECTTYPE_PBUFFER;
  spec_07.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_07,"pbuffer_context",
             "PBuffer and context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  uStack_134 = CONCAT31(uStack_134._1_3_,1);
  spec_08._20_4_ = uStack_134;
  spec_08.maxHeight = 0x400;
  spec_08.minHeight = 0x40;
  spec_08.maxWidth = 0x400;
  spec_08.types = OBJECTTYPE_CONTEXT|OBJECTTYPE_PBUFFER;
  spec_08.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_08,"pbuffer_context_use",
             "PBuffer and context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  return extraout_EAX;
}

Assistant:

void MemoryStressTests::init (void)
{
	// Check small pbuffers 256x256
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 256;
		spec.minHeight	= 256;
		spec.maxWidth	= 256;
		spec.maxHeight	= 256;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_256x256", "PBuffer allocation stress tests"));
	}

	// Check small pbuffers 256x256 and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 256;
		spec.minHeight	= 256;
		spec.maxWidth	= 256;
		spec.maxHeight	= 256;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_256x256_use", "PBuffer allocation stress tests"));
	}

	// Check big pbuffers 1024x1024
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_1024x1024", "PBuffer allocation stress tests"));
	}

	// Check big pbuffers 1024x1024 and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_1024x1024_use", "PBuffer allocation stress tests"));
	}

	// Check different sized pbuffers
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer", "PBuffer allocation stress tests"));
	}

	// Check different sized pbuffers and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_use", "PBuffer allocation stress tests"));
	}

	// Check contexts
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_CONTEXT;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "context", "Context allocation stress tests"));
	}

	// Check contexts and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_CONTEXT;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "context_use", "Context allocation stress tests"));
	}

	// Check contexts and pbuffers
	{
		MemoryStressCase::Spec spec;

		spec.types		= (ObjectType)(OBJECTTYPE_PBUFFER|OBJECTTYPE_CONTEXT);
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_context", "PBuffer and context allocation stress tests"));
	}

	// Check contexts and pbuffers and use
	{
		MemoryStressCase::Spec spec;

		spec.types		= (ObjectType)(OBJECTTYPE_PBUFFER|OBJECTTYPE_CONTEXT);
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_context_use", "PBuffer and context allocation stress tests"));
	}
}